

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

void check_attr_handler(_internal_exr_context *pctxt,exr_attribute_t *attr)

{
  exr_result_t eVar1;
  exr_attribute_t *handler;
  exr_attribute_t *local_18;
  
  if (attr->type == EXR_ATTR_OPAQUE) {
    local_18 = (exr_attribute_t *)0x0;
    eVar1 = exr_attr_list_find_by_name
                      ((exr_const_context_t)pctxt,&pctxt->custom_handlers,attr->type_name,&local_18)
    ;
    if (local_18 != (exr_attribute_t *)0x0 && eVar1 == 0) {
      ((attr->field_6).m33d)->m[4] = ((local_18->field_6).m33d)->m[4];
      ((attr->field_6).m33d)->m[5] = ((local_18->field_6).m33d)->m[5];
      ((attr->field_6).m33d)->m[6] = ((local_18->field_6).m33d)->m[6];
    }
  }
  return;
}

Assistant:

static void
check_attr_handler (struct _internal_exr_context* pctxt, exr_attribute_t* attr)
{
    if (attr->type == EXR_ATTR_OPAQUE)
    {
        exr_attribute_t* handler = NULL;
        exr_result_t     rv      = exr_attr_list_find_by_name (
            (exr_const_context_t) pctxt,
            &(pctxt->custom_handlers),
            attr->type_name,
            &handler);
        if (rv == EXR_ERR_SUCCESS && handler)
        {
            attr->opaque->unpack_func_ptr = handler->opaque->unpack_func_ptr;
            attr->opaque->pack_func_ptr   = handler->opaque->pack_func_ptr;
            attr->opaque->destroy_unpacked_func_ptr =
                handler->opaque->destroy_unpacked_func_ptr;
        }
    }
}